

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

ostream * std::operator<<(ostream *ofs,Reference *v)

{
  string local_68;
  string local_48;
  
  operator<<(ofs,&v->asset_path);
  if ((v->prim_path)._valid == true) {
    operator<<(ofs,&v->prim_path);
  }
  operator<<(ofs,&v->layerOffset);
  if ((v->customData)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    __cxx11::string::_M_construct<char_const*>((string *)&local_68,"customData","");
    tinyusdz::print_customData(&local_48,&v->customData,&local_68,0);
    std::__ostream_insert<char,std::char_traits<char>>
              (ofs,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Reference &v) {
  ofs << v.asset_path;
  if (v.prim_path.is_valid()) {
    ofs << v.prim_path;
  }
  ofs << v.layerOffset;
  if (!v.customData.empty()) {
    ofs << tinyusdz::print_customData(v.customData, "customData",
                                      /* indent */ 0);
  }

  return ofs;
}